

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_data_mainmod_with_include(lyout *out,lys_module *mod)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  lys_module *plVar4;
  lys_node *plVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *local_80;
  char *local_58;
  lys_module *mainmod;
  lys_node *node;
  int from_include;
  int first;
  lys_module *mod_local;
  lyout *out_local;
  
  bVar1 = true;
  plVar4 = lys_main_module(mod);
  ly_print(out,"%-*s",0xb,"Data: ");
  if (plVar4->data != (lys_node *)0x0) {
    for (mainmod = (lys_module *)plVar4->data; mainmod != (lys_module *)0x0;
        mainmod = *(lys_module **)&mainmod->ext_size) {
      if ((lys_module *)mainmod->contact == mod) {
        bVar2 = false;
LAB_001e341e:
        plVar5 = lys_parent((lys_node *)mainmod);
        if (((plVar5 != (lys_node *)0x0) ||
            (iVar3 = strcmp((char *)mainmod->ctx,"config"), iVar3 != 0)) ||
           (iVar3 = strcmp(*(char **)(mainmod->contact + 8),"ietf-netconf"), iVar3 != 0)) {
          if (bVar1) {
            pcVar6 = strnodetype(*(LYS_NODE *)&mainmod->filepath);
            pcVar7 = "";
            if (bVar2) {
              pcVar7 = " (";
              local_58 = *(char **)(mainmod->contact + 8);
            }
            else {
              local_58 = "";
            }
            pcVar8 = "";
            if (bVar2) {
              pcVar8 = ")";
            }
            ly_print(out,"%s \"%s\"%s%s%s\n",pcVar6,mainmod->ctx,pcVar7,local_58,pcVar8);
            bVar1 = false;
          }
          else {
            pcVar6 = strnodetype(*(LYS_NODE *)&mainmod->filepath);
            pcVar7 = "";
            if (bVar2) {
              pcVar7 = " (";
              local_80 = *(char **)(mainmod->contact + 8);
            }
            else {
              local_80 = "";
            }
            pcVar8 = "";
            if (bVar2) {
              pcVar8 = ")";
            }
            ly_print(out,"%*s%s \"%s\"%s%s%s\n",0xb,"",pcVar6,mainmod->ctx,pcVar7,local_80,pcVar8);
          }
        }
      }
      else if (plVar4 == mod) {
        bVar2 = true;
        goto LAB_001e341e;
      }
    }
  }
  if (bVar1) {
    ly_print(out,"\n");
  }
  return;
}

Assistant:

static void
info_print_data_mainmod_with_include(struct lyout *out, const struct lys_module *mod)
{
    int first = 1, from_include;
    struct lys_node *node;
    const struct lys_module *mainmod = lys_main_module(mod);

    ly_print(out, "%-*s", INDENT_LEN, "Data: ");

    if (mainmod->data) {
        LY_TREE_FOR(mainmod->data, node) {
            if (node->module != mod) {
                if (mainmod != mod) {
                    continue;
                } else {
                    from_include = 1;
                }
            } else {
                from_include = 0;
            }

            if (!lys_parent(node) && !strcmp(node->name, "config") && !strcmp(node->module->name, "ietf-netconf")) {
                /* node added by libyang, not actually in the model */
                continue;
            }

            if (first) {
                ly_print(out, "%s \"%s\"%s%s%s\n", strnodetype(node->nodetype), node->name, (from_include ? " (" : ""),
                                                   (from_include ? node->module->name : ""), (from_include ? ")" : ""));
                first = 0;
            } else {
                ly_print(out, "%*s%s \"%s\"%s%s%s\n", INDENT_LEN, "", strnodetype(node->nodetype), node->name,
                        (from_include ? " (" : ""), (from_include ? node->module->name : ""), (from_include ? ")" : ""));
            }
        }
    }

    if (first) {
        ly_print(out, "\n");
    }
}